

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfoMB *
embree::avx::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  task *ptVar5;
  runtime_error *prVar6;
  ulong uVar7;
  PrimInfoMB *pPVar8;
  ulong uVar9;
  size_t i_2;
  ulong uVar10;
  size_t i_1;
  size_t sVar11;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this;
  ulong uVar12;
  ulong uVar13;
  size_t N;
  ulong uVar14;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_00;
  size_t i;
  size_t sVar15;
  unsigned_long end;
  undefined8 this_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar18 [64];
  undefined1 local_4f0a;
  auto_partitioner local_4f09;
  size_t taskCount;
  BBox1f t0t1_local;
  undefined1 local_4ef8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4ee8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4ed8;
  undefined1 local_4ec8 [16];
  undefined1 local_4eb8 [16];
  Iterator2 *local_4ea8;
  Iterator2 iter;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4df8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4de8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4de0;
  undefined1 *local_4dd8;
  float *local_4dd0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d58;
  undefined4 local_4d48;
  undefined4 uStack_4d44;
  undefined4 uStack_4d40;
  undefined4 uStack_4d3c;
  undefined4 local_4d38;
  undefined4 uStack_4d34;
  undefined4 uStack_4d30;
  undefined4 uStack_4d2c;
  undefined4 local_4d28;
  undefined4 uStack_4d24;
  undefined4 uStack_4d20;
  undefined4 uStack_4d1c;
  undefined4 local_4d18;
  undefined4 uStack_4d14;
  undefined4 uStack_4d10;
  undefined4 uStack_4d0c;
  undefined8 local_4d08;
  undefined8 uStack_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined4 local_4ce8;
  undefined8 local_4ce4;
  undefined4 local_4cdc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4cd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4cc8;
  undefined4 local_4cb8;
  undefined4 uStack_4cb4;
  undefined4 uStack_4cb0;
  undefined4 uStack_4cac;
  undefined4 local_4ca8;
  undefined4 uStack_4ca4;
  undefined4 uStack_4ca0;
  undefined4 uStack_4c9c;
  undefined4 local_4c98;
  undefined4 uStack_4c94;
  undefined4 uStack_4c90;
  undefined4 uStack_4c8c;
  undefined4 local_4c88;
  undefined4 uStack_4c84;
  undefined4 uStack_4c80;
  undefined4 uStack_4c7c;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined4 local_4c58;
  undefined8 local_4c54;
  undefined4 local_4c4c;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  
  auVar18._8_56_ = in_register_00001208;
  auVar18._0_8_ = t0t1;
  t0t1_local = (BBox1f)vmovlps_avx(auVar18._0_16_);
  pstate.super_ParallelForForState.taskCount = 0;
  iter.mblur = true;
  local_4ee8._8_8_ = prims;
  local_4ed8._8_8_ = progressMonitor;
  local_4ec8._0_8_ = numPrimRefs;
  iter.scene = scene;
  iter.typemask = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  sVar11 = (scene->geometries).size_active;
  uVar14 = 0;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  for (sVar15 = 0; sVar11 != sVar15; sVar15 = sVar15 + 1) {
    sVar3 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::operator()
                      ((anon_class_8_1_4d25ca37 *)&context,sVar15);
    uVar14 = uVar14 + sVar3;
  }
  local_4ee8._0_8_ = __return_storage_ptr__;
  pstate.super_ParallelForForState.N = uVar14;
  iVar2 = tbb::detail::d1::max_concurrency();
  uVar7 = uVar14 + 0x3ff >> 10;
  if ((ulong)(long)iVar2 < uVar7) {
    uVar7 = (long)iVar2;
  }
  uVar4 = 0x40;
  if (uVar7 < 0x40) {
    uVar4 = uVar7;
  }
  sVar11 = 0;
  pstate.super_ParallelForForState.taskCount = uVar4 + (uVar4 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar4 = uVar14 / pstate.super_ParallelForForState.taskCount;
  uVar7 = 1;
  uVar10 = 0;
  while (sVar15 = pstate.super_ParallelForForState.taskCount,
        uVar7 < pstate.super_ParallelForForState.taskCount) {
    sVar15 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&context,sVar11);
    uVar12 = (uVar7 + 1) * uVar14;
    uVar13 = 0;
    uVar9 = uVar10;
    for (; ((uVar10 = (uVar9 + sVar15) - uVar13, uVar13 < sVar15 && (uVar4 <= uVar10)) &&
           (uVar7 < pstate.super_ParallelForForState.taskCount)); uVar7 = uVar7 + 1) {
      pstate.super_ParallelForForState.i0[uVar7] = sVar11;
      uVar13 = uVar13 + (uVar4 - uVar9);
      pstate.super_ParallelForForState.j0[uVar7] = uVar13;
      uVar10 = uVar12 / pstate.super_ParallelForForState.taskCount;
      uVar12 = uVar12 + uVar14;
      uVar9 = uVar4;
      uVar4 = uVar10;
    }
    sVar11 = sVar11 + 1;
  }
  local_4de8 = &local_4d68;
  local_4d68._0_8_ = 0x7f8000007f800000;
  local_4d68.m128[2] = INFINITY;
  local_4d68.m128[3] = INFINITY;
  local_4d58._0_8_ = 0xff800000ff800000;
  local_4d58._8_8_ = 0xff800000ff800000;
  local_4d48 = 0x7f800000;
  uStack_4d44 = 0x7f800000;
  uStack_4d40 = 0x7f800000;
  uStack_4d3c = 0x7f800000;
  local_4d38 = 0xff800000;
  uStack_4d34 = 0xff800000;
  uStack_4d30 = 0xff800000;
  uStack_4d2c = 0xff800000;
  local_4d28 = 0x7f800000;
  uStack_4d24 = 0x7f800000;
  uStack_4d20 = 0x7f800000;
  uStack_4d1c = 0x7f800000;
  local_4d18 = 0xff800000;
  uStack_4d14 = 0xff800000;
  uStack_4d10 = 0xff800000;
  uStack_4d0c = 0xff800000;
  local_4d08 = 0;
  uStack_4d00 = 0;
  uStack_4cf8 = 0;
  uStack_4cf0 = 0;
  local_4ce8 = 0;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  local_4ce4 = vmovlps_avx(auVar16);
  local_4cdc = 0;
  local_4eb8._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ec8)->m128 + 2;
  local_4ec8._8_8_ = local_4ee8._8_8_;
  local_4eb8._0_8_ = &t0t1_local;
  local_4de0 = &local_4ed8;
  local_4ed8._0_8_ = &iter;
  local_4dd0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4eb8)->m128 + 2;
  pPVar8 = (PrimInfoMB *)&taskCount;
  local_4df8._0_8_ = &pstate;
  local_4dd8 = &local_4f0a;
  taskCount = pstate.super_ParallelForForState.taskCount;
  local_4ea8 = (Iterator2 *)local_4ed8._0_8_;
  local_4df8._8_8_ = pPVar8;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_4ef8._0_8_ = &local_4df8;
  if (sVar15 != 0) {
    local_4ef8._8_8_ = 0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)(local_4ef8 + 8),0xc0);
    ptVar5->m_reserved[2] = 0;
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[5] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_021ef230;
    ptVar5[1]._vptr_task = (_func_int **)sVar15;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)local_4ef8;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar5[1].m_reserved + 5),&local_4f09);
    ptVar5[2].super_task_traits.m_version_and_traits = local_4ef8._8_8_;
    local_4cd8._0_8_ = 0;
    local_4cd8.m128[2] = 1.4013e-45;
    local_4cc8._0_8_ = 1;
    local_4cc8._8_8_ = 1;
    ptVar5[1].m_reserved[4] = (uint64_t)&local_4cd8;
    pPVar8 = (PrimInfoMB *)&context;
    tbb::detail::r1::execute_and_wait
              (ptVar5,(task_group_context *)pPVar8,(wait_context *)&local_4cc8.field_1,
               (task_group_context *)pPVar8);
  }
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  this_01 = local_4ee8._0_8_;
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)this_01,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
    this = pstate.prefix_state.sums;
    this_00 = this;
    for (uVar14 = 0; uVar14 < taskCount; uVar14 = uVar14 + 1) {
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_00 + -0x40);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                (this_00,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)this_01);
      createPrimRefArrayMSMBlur::anon_class_1_0_00000001::operator()
                ((PrimInfoMB *)&local_4df8.field_1,(anon_class_1_0_00000001 *)this_01,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,pPVar8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)this_01,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4df8.field_1);
      this_00 = this_00 + 1;
    }
    if (*(unsigned_long *)(this_01 + 0x68) - ((range<unsigned_long> *)(this_01 + 0x60))->_begin !=
        local_4ec8._0_8_) {
      (***(_func_int ***)local_4ed8._8_8_)(local_4ed8._8_8_,0);
      sVar11 = pstate.super_ParallelForForState.taskCount;
      local_4de8 = &local_4cd8;
      local_4cd8._0_8_ = 0x7f8000007f800000;
      local_4cd8.m128[2] = INFINITY;
      local_4cd8.m128[3] = INFINITY;
      local_4cc8._0_8_ = 0xff800000ff800000;
      local_4cc8._8_8_ = 0xff800000ff800000;
      local_4cb8 = 0x7f800000;
      uStack_4cb4 = 0x7f800000;
      uStack_4cb0 = 0x7f800000;
      uStack_4cac = 0x7f800000;
      local_4ca8 = 0xff800000;
      uStack_4ca4 = 0xff800000;
      uStack_4ca0 = 0xff800000;
      uStack_4c9c = 0xff800000;
      local_4c98 = 0x7f800000;
      uStack_4c94 = 0x7f800000;
      uStack_4c90 = 0x7f800000;
      uStack_4c8c = 0x7f800000;
      local_4c88 = 0xff800000;
      uStack_4c84 = 0xff800000;
      uStack_4c80 = 0xff800000;
      uStack_4c7c = 0xff800000;
      local_4c78 = 0;
      uStack_4c70 = 0;
      uStack_4c68 = 0;
      uStack_4c60 = 0;
      local_4c58 = 0;
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      local_4c54 = vmovlps_avx(auVar17);
      local_4c4c = 0;
      local_4ec8._8_8_ = local_4ee8._8_8_;
      local_4eb8._0_8_ = &t0t1_local;
      local_4ed8._0_8_ = &iter;
      local_4eb8._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ec8)->m128 + 2;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_4df8._0_8_ = &pstate;
      pPVar8 = (PrimInfoMB *)&taskCount;
      local_4de0 = &local_4ed8;
      local_4dd8 = &local_4f0a;
      local_4dd0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4eb8)->m128 + 2;
      local_4ea8 = (Iterator2 *)local_4ed8._0_8_;
      local_4df8._8_8_ = pPVar8;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_4ef8._0_8_ = &local_4df8;
      if (sVar11 != 0) {
        local_4ef8._8_8_ = 0;
        ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)(local_4ef8 + 8),0xc0);
        ptVar5->m_reserved[2] = 0;
        ptVar5->m_reserved[3] = 0;
        ptVar5->m_reserved[4] = 0;
        ptVar5->m_reserved[5] = 0;
        (ptVar5->super_task_traits).m_version_and_traits = 0;
        ptVar5->m_reserved[0] = 0;
        ptVar5->m_reserved[1] = 0;
        ptVar5->m_reserved[2] = 0;
        ptVar5->_vptr_task = (_func_int **)&PTR__task_021ef278;
        ptVar5[1]._vptr_task = (_func_int **)sVar11;
        ptVar5[1].super_task_traits.m_version_and_traits = 0;
        ptVar5[1].m_reserved[0] = 1;
        ptVar5[1].m_reserved[1] = (uint64_t)local_4ef8;
        ptVar5[1].m_reserved[2] = 0;
        ptVar5[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar5[1].m_reserved + 5),&local_4f09);
        ptVar5[2].super_task_traits.m_version_and_traits = local_4ef8._8_8_;
        local_4d68._0_8_ = 0;
        local_4d68.m128[2] = 1.4013e-45;
        local_4d58._0_8_ = 1;
        local_4d58._8_8_ = 1;
        ptVar5[1].m_reserved[4] = (uint64_t)&local_4d68;
        pPVar8 = (PrimInfoMB *)&context;
        tbb::detail::r1::execute_and_wait
                  (ptVar5,(task_group_context *)pPVar8,(wait_context *)&local_4d58.field_1,
                   (task_group_context *)pPVar8);
      }
      cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar1 != '\0') {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"task cancelled");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1);
      for (uVar14 = 0; this_01 = local_4ee8._0_8_, uVar14 < taskCount; uVar14 = uVar14 + 1) {
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this + -0x40);
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                  (this,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
        createPrimRefArrayMSMBlur::anon_class_1_0_00000001::operator()
                  ((PrimInfoMB *)&local_4df8.field_1,(anon_class_1_0_00000001 *)&local_4d68.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,pPVar8);
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4df8.field_1);
        this = this + 1;
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_4ee8._0_8_,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
    }
    ((PrimInfoMB *)this_01)->time_range = t0t1_local;
    return (PrimInfoMB *)this_01;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"task cancelled");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            return mesh->createPrimRefMBArray(prims,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }